

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_base_free_(event_base *base,int run_finalizers)

{
  common_timeout_list *ptr;
  common_timeout_list *pcVar1;
  event_once *ptr_00;
  uint uVar2;
  int iVar3;
  event *ev_00;
  void *lock_tmp_;
  event_once *eonce;
  int i_1;
  event *next;
  common_timeout_list *ctl;
  event *ev;
  int local_18;
  int n_deleted;
  int i;
  int run_finalizers_local;
  event_base *base_local;
  
  ev._4_4_ = 0;
  _i = base;
  if ((base == (event_base *)0x0) && (event_global_current_base_ != (event_base *)0x0)) {
    _i = event_global_current_base_;
  }
  if (_i == (event_base *)0x0) {
    event_warnx("%s: no base to free","event_base_free_");
  }
  else {
    if (_i->th_notify_fd[0] != -1) {
      event_del(&_i->th_notify);
      evutil_closesocket(_i->th_notify_fd[0]);
      if (_i->th_notify_fd[1] != -1) {
        evutil_closesocket(_i->th_notify_fd[1]);
      }
      _i->th_notify_fd[0] = -1;
      _i->th_notify_fd[1] = -1;
      event_debug_unassign(&_i->th_notify);
    }
    evmap_delete_all_(_i);
    while (ev_00 = min_heap_top_(&_i->timeheap), ev_00 != (event *)0x0) {
      event_del(ev_00);
      ev._4_4_ = ev._4_4_ + 1;
    }
    for (local_18 = 0; local_18 < _i->n_common_timeouts; local_18 = local_18 + 1) {
      ptr = _i->common_timeout_queues[local_18];
      event_del(&ptr->timeout_event);
      event_debug_unassign(&ptr->timeout_event);
      pcVar1 = (common_timeout_list *)(ptr->events).tqh_first;
      while (ctl = pcVar1, ctl != (common_timeout_list *)0x0) {
        pcVar1 = (common_timeout_list *)(ctl->timeout_event).ev_evcallback.evcb_active_next.tqe_prev
        ;
        if (((ctl->duration).tv_sec & 0x10) == 0) {
          event_del((event *)ctl);
          ev._4_4_ = ev._4_4_ + 1;
        }
      }
      event_mm_free_(ptr);
    }
    if (_i->common_timeout_queues != (common_timeout_list **)0x0) {
      event_mm_free_(_i->common_timeout_queues);
    }
    while( true ) {
      uVar2 = event_base_free_queues_(_i,run_finalizers);
      if (event_debug_logging_mask_ != 0) {
        event_debugx_("%s: %d events freed","event_base_free_",(ulong)uVar2);
      }
      if (uVar2 == 0) break;
      ev._4_4_ = uVar2 + ev._4_4_;
    }
    if ((ev._4_4_ != 0) && (event_debug_logging_mask_ != 0)) {
      event_debugx_("%s: %d events were still set in base","event_base_free_",(ulong)ev._4_4_);
    }
    while ((_i->once_events).lh_first != (event_once *)0x0) {
      ptr_00 = (_i->once_events).lh_first;
      if ((ptr_00->next_once).le_next != (event_once *)0x0) {
        (((ptr_00->next_once).le_next)->next_once).le_prev = (ptr_00->next_once).le_prev;
      }
      *(ptr_00->next_once).le_prev = (ptr_00->next_once).le_next;
      event_mm_free_(ptr_00);
    }
    if ((_i->evsel != (eventop *)0x0) && (_i->evsel->dealloc != (_func_void_event_base_ptr *)0x0)) {
      (*_i->evsel->dealloc)(_i);
    }
    for (local_18 = 0; local_18 < _i->nactivequeues; local_18 = local_18 + 1) {
      if (_i->activequeues[local_18].tqh_first != (event_callback *)0x0) {
        event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                   ,0x3a0,"TAILQ_EMPTY(&base->activequeues[i])","event_base_free_");
      }
    }
    iVar3 = min_heap_empty_(&_i->timeheap);
    if (iVar3 == 0) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
                 ,0x3a2,"min_heap_empty_(&base->timeheap)","event_base_free_");
    }
    min_heap_dtor_(&_i->timeheap);
    event_mm_free_(_i->activequeues);
    evmap_io_clear_(&_i->io);
    evmap_signal_clear_(&_i->sigmap);
    event_changelist_freemem_(&_i->changelist);
    if ((_i->th_base_lock != (void *)0x0) &&
       (evthread_lock_fns_.free != (_func_void_void_ptr_uint *)0x0)) {
      (*evthread_lock_fns_.free)(_i->th_base_lock,0);
    }
    if (_i->current_event_cond != (void *)0x0) {
      (*evthread_cond_fns_.free_condition)(_i->current_event_cond);
    }
    if (_i == event_global_current_base_) {
      event_global_current_base_ = (event_base *)0x0;
    }
    event_mm_free_(_i);
  }
  return;
}

Assistant:

static void
event_base_free_(struct event_base *base, int run_finalizers)
{
	int i, n_deleted=0;
	struct event *ev;
	/* XXXX grab the lock? If there is contention when one thread frees
	 * the base, then the contending thread will be very sad soon. */

	/* event_base_free(NULL) is how to free the current_base if we
	 * made it with event_init and forgot to hold a reference to it. */
	if (base == NULL && current_base)
		base = current_base;
	/* Don't actually free NULL. */
	if (base == NULL) {
		event_warnx("%s: no base to free", __func__);
		return;
	}
	/* XXX(niels) - check for internal events first */

#ifdef _WIN32
	event_base_stop_iocp_(base);
#endif

	/* threading fds if we have them */
	if (base->th_notify_fd[0] != -1) {
		event_del(&base->th_notify);
		EVUTIL_CLOSESOCKET(base->th_notify_fd[0]);
		if (base->th_notify_fd[1] != -1)
			EVUTIL_CLOSESOCKET(base->th_notify_fd[1]);
		base->th_notify_fd[0] = -1;
		base->th_notify_fd[1] = -1;
		event_debug_unassign(&base->th_notify);
	}

	/* Delete all non-internal events. */
	evmap_delete_all_(base);

	while ((ev = min_heap_top_(&base->timeheap)) != NULL) {
		event_del(ev);
		++n_deleted;
	}
	for (i = 0; i < base->n_common_timeouts; ++i) {
		struct common_timeout_list *ctl =
		    base->common_timeout_queues[i];
		event_del(&ctl->timeout_event); /* Internal; doesn't count */
		event_debug_unassign(&ctl->timeout_event);
		for (ev = TAILQ_FIRST(&ctl->events); ev; ) {
			struct event *next = TAILQ_NEXT(ev,
			    ev_timeout_pos.ev_next_with_common_timeout);
			if (!(ev->ev_flags & EVLIST_INTERNAL)) {
				event_del(ev);
				++n_deleted;
			}
			ev = next;
		}
		mm_free(ctl);
	}
	if (base->common_timeout_queues)
		mm_free(base->common_timeout_queues);

	for (;;) {
		/* For finalizers we can register yet another finalizer out from
		 * finalizer, and iff finalizer will be in active_later_queue we can
		 * add finalizer to activequeues, and we will have events in
		 * activequeues after this function returns, which is not what we want
		 * (we even have an assertion for this).
		 *
		 * A simple case is bufferevent with underlying (i.e. filters).
		 */
		int i = event_base_free_queues_(base, run_finalizers);
		event_debug(("%s: %d events freed", __func__, i));
		if (!i) {
			break;
		}
		n_deleted += i;
	}

	if (n_deleted)
		event_debug(("%s: %d events were still set in base",
			__func__, n_deleted));

	while (LIST_FIRST(&base->once_events)) {
		struct event_once *eonce = LIST_FIRST(&base->once_events);
		LIST_REMOVE(eonce, next_once);
		mm_free(eonce);
	}

	if (base->evsel != NULL && base->evsel->dealloc != NULL)
		base->evsel->dealloc(base);

	for (i = 0; i < base->nactivequeues; ++i)
		EVUTIL_ASSERT(TAILQ_EMPTY(&base->activequeues[i]));

	EVUTIL_ASSERT(min_heap_empty_(&base->timeheap));
	min_heap_dtor_(&base->timeheap);

	mm_free(base->activequeues);

	evmap_io_clear_(&base->io);
	evmap_signal_clear_(&base->sigmap);
	event_changelist_freemem_(&base->changelist);

	EVTHREAD_FREE_LOCK(base->th_base_lock, 0);
	EVTHREAD_FREE_COND(base->current_event_cond);

	/* If we're freeing current_base, there won't be a current_base. */
	if (base == current_base)
		current_base = NULL;
	mm_free(base);
}